

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

void Abc_NtkDelete(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Att_t *p;
  int local_28;
  int i;
  int TotalMemory;
  void *pAttrMan;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk != (Abc_Ntk_t *)0x0) {
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      Abc_NtkDelete(pNtk->pExdc);
    }
    if (pNtk->pExcare != (void *)0x0) {
      Abc_NtkDelete((Abc_Ntk_t *)pNtk->pExcare);
    }
    iVar1 = Abc_NtkHasBdd(pNtk);
    if (iVar1 != 0) {
      for (local_28 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_28 < iVar1; local_28 = local_28 + 1
          ) {
        pAVar2 = Abc_NtkObj(pNtk,local_28);
        if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) {
          Cudd_RecursiveDeref((DdManager *)pNtk->pManFunc,(DdNode *)(pAVar2->field_5).pData);
        }
      }
    }
    for (local_28 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_28 < iVar1; local_28 = local_28 + 1)
    {
      pAVar2 = Abc_NtkObj(pNtk,local_28);
      if (pAVar2 != (Abc_Obj_t *)0x0) {
        if ((*(uint *)&pAVar2->field_0x14 >> 4 & 1) != 0) {
          __assert_fail("pObj->fMarkA == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                        ,0x521,"void Abc_NtkDelete(Abc_Ntk_t *)");
        }
        if ((*(uint *)&pAVar2->field_0x14 >> 5 & 1) != 0) {
          __assert_fail("pObj->fMarkB == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                        ,0x522,"void Abc_NtkDelete(Abc_Ntk_t *)");
        }
        if ((*(uint *)&pAVar2->field_0x14 >> 6 & 1) != 0) {
          __assert_fail("pObj->fMarkC == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                        ,0x523,"void Abc_NtkDelete(Abc_Ntk_t *)");
        }
      }
    }
    if (pNtk->pMmStep == (Mem_Step_t *)0x0) {
      for (local_28 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_28 < iVar1; local_28 = local_28 + 1
          ) {
        pAVar2 = Abc_NtkObj(pNtk,local_28);
        if (pAVar2 != (Abc_Obj_t *)0x0) {
          if ((pAVar2->vFanouts).pArray != (int *)0x0) {
            free((pAVar2->vFanouts).pArray);
            (pAVar2->vFanouts).pArray = (int *)0x0;
          }
          if ((pAVar2->vFanins).pArray != (int *)0x0) {
            free((pAVar2->vFanins).pArray);
            (pAVar2->vFanins).pArray = (int *)0x0;
          }
        }
      }
    }
    if (pNtk->pMmObj == (Mem_Fixed_t *)0x0) {
      for (local_28 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_28 < iVar1; local_28 = local_28 + 1
          ) {
        pAVar2 = Abc_NtkObj(pNtk,local_28);
        if ((pAVar2 != (Abc_Obj_t *)0x0) && (pAVar2 != (Abc_Obj_t *)0x0)) {
          free(pAVar2);
        }
      }
    }
    Vec_PtrFree(pNtk->vPios);
    Vec_PtrFree(pNtk->vPis);
    Vec_PtrFree(pNtk->vPos);
    Vec_PtrFree(pNtk->vCis);
    Vec_PtrFree(pNtk->vCos);
    Vec_PtrFree(pNtk->vObjs);
    Vec_PtrFree(pNtk->vBoxes);
    if ((pNtk->vTravIds).pArray != (int *)0x0) {
      free((pNtk->vTravIds).pArray);
      (pNtk->vTravIds).pArray = (int *)0x0;
    }
    if (pNtk->vLevelsR != (Vec_Int_t *)0x0) {
      Vec_IntFree(pNtk->vLevelsR);
    }
    if (pNtk->pModel != (int *)0x0) {
      free(pNtk->pModel);
      pNtk->pModel = (int *)0x0;
    }
    if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
      free(pNtk->pSeqModel);
      pNtk->pSeqModel = (Abc_Cex_t *)0x0;
    }
    if (pNtk->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      Vec_PtrFreeFree(pNtk->vSeqModelVec);
    }
    if (pNtk->pMmObj != (Mem_Fixed_t *)0x0) {
      Mem_FixedReadMemUsage(pNtk->pMmObj);
    }
    if (pNtk->pMmStep != (Mem_Step_t *)0x0) {
      Mem_StepReadMemUsage(pNtk->pMmStep);
    }
    if (pNtk->pMmObj != (Mem_Fixed_t *)0x0) {
      Mem_FixedStop(pNtk->pMmObj,0);
    }
    if (pNtk->pMmStep != (Mem_Step_t *)0x0) {
      Mem_StepStop(pNtk->pMmStep,0);
    }
    Nm_ManFree(pNtk->pManName);
    if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
      Abc_ManTimeStop(pNtk->pManTime);
    }
    Vec_IntFreeP(&pNtk->vPhases);
    iVar1 = Abc_NtkIsStrash(pNtk);
    if (iVar1 == 0) {
      iVar1 = Abc_NtkHasSop(pNtk);
      if ((iVar1 == 0) && (iVar1 = Abc_NtkHasBlifMv(pNtk), iVar1 == 0)) {
        iVar1 = Abc_NtkHasBdd(pNtk);
        if (iVar1 == 0) {
          iVar1 = Abc_NtkHasAig(pNtk);
          if (iVar1 == 0) {
            iVar1 = Abc_NtkHasMapping(pNtk);
            if (iVar1 == 0) {
              iVar1 = Abc_NtkHasBlackbox(pNtk);
              if (iVar1 == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                              ,0x55f,"void Abc_NtkDelete(Abc_Ntk_t *)");
              }
            }
            else {
              pNtk->pManFunc = (void *)0x0;
            }
          }
          else if (pNtk->pManFunc != (void *)0x0) {
            Hop_ManStop((Hop_Man_t *)pNtk->pManFunc);
          }
        }
        else {
          Extra_StopManager((DdManager *)pNtk->pManFunc);
        }
      }
      else {
        Mem_FlexStop((Mem_Flex_t *)pNtk->pManFunc,0);
      }
    }
    else {
      Abc_AigFree((Abc_Aig_t *)pNtk->pManFunc);
    }
    if (pNtk->pDesign != (Abc_Des_t *)0x0) {
      Abc_DesFree(pNtk->pDesign,pNtk);
      pNtk->pDesign = (Abc_Des_t *)0x0;
    }
    for (local_28 = 0; iVar1 = Vec_PtrSize(pNtk->vAttrs), local_28 < iVar1; local_28 = local_28 + 1)
    {
      p = (Vec_Att_t *)Vec_PtrEntry(pNtk->vAttrs,local_28);
      if (p != (Vec_Att_t *)0x0) {
        Vec_AttFree(p,1);
      }
    }
    if (pNtk->pSCLib != (void *)0x0) {
      __assert_fail("pNtk->pSCLib == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                    ,0x56c,"void Abc_NtkDelete(Abc_Ntk_t *)");
    }
    Vec_IntFreeP(&pNtk->vGates);
    Vec_PtrFree(pNtk->vAttrs);
    Vec_IntFreeP(&pNtk->vNameIds);
    if (pNtk->pWLoadUsed != (char *)0x0) {
      free(pNtk->pWLoadUsed);
      pNtk->pWLoadUsed = (char *)0x0;
    }
    if (pNtk->pName != (char *)0x0) {
      free(pNtk->pName);
      pNtk->pName = (char *)0x0;
    }
    if (pNtk->pSpec != (char *)0x0) {
      free(pNtk->pSpec);
      pNtk->pSpec = (char *)0x0;
    }
    if (pNtk->pLutTimes != (float *)0x0) {
      free(pNtk->pLutTimes);
      pNtk->pLutTimes = (float *)0x0;
    }
    if (pNtk->vOnehots != (Vec_Ptr_t *)0x0) {
      Vec_VecFree((Vec_Vec_t *)pNtk->vOnehots);
    }
    Vec_PtrFreeP(&pNtk->vLtlProperties);
    Vec_IntFreeP(&pNtk->vObjPerm);
    Vec_IntFreeP(&pNtk->vTopo);
    if (pNtk != (Abc_Ntk_t *)0x0) {
      free(pNtk);
    }
  }
  return;
}

Assistant:

void Abc_NtkDelete( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    void * pAttrMan;
    int TotalMemory, i;
//    int LargePiece = (4 << ABC_NUM_STEPS);
    if ( pNtk == NULL )
        return;
    // free EXDC Ntk
    if ( pNtk->pExdc )
        Abc_NtkDelete( pNtk->pExdc );
    if ( pNtk->pExcare )
        Abc_NtkDelete( (Abc_Ntk_t *)pNtk->pExcare );
    // dereference the BDDs
    if ( Abc_NtkHasBdd(pNtk) )
    {
#ifdef ABC_USE_CUDD
        Abc_NtkForEachNode( pNtk, pObj, i )
            Cudd_RecursiveDeref( (DdManager *)pNtk->pManFunc, (DdNode *)pObj->pData );
#endif
    }
    // make sure all the marks are clean
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        // free large fanout arrays
//        if ( pNtk->pMmObj && pObj->vFanouts.nCap * 4 > LargePiece )
//            ABC_FREE( pObj->vFanouts.pArray );
        // these flags should be always zero
        // if this is not true, something is wrong somewhere
        assert( pObj->fMarkA == 0 );
        assert( pObj->fMarkB == 0 );
        assert( pObj->fMarkC == 0 );
    }
    // free the nodes
    if ( pNtk->pMmStep == NULL )
    {
        Abc_NtkForEachObj( pNtk, pObj, i )
        {
            ABC_FREE( pObj->vFanouts.pArray );
            ABC_FREE( pObj->vFanins.pArray );
        }
    }
    if ( pNtk->pMmObj == NULL )
    {
        Abc_NtkForEachObj( pNtk, pObj, i )
            ABC_FREE( pObj );
    }
        
    // free the arrays
    Vec_PtrFree( pNtk->vPios );
    Vec_PtrFree( pNtk->vPis );
    Vec_PtrFree( pNtk->vPos );
    Vec_PtrFree( pNtk->vCis );
    Vec_PtrFree( pNtk->vCos );
    Vec_PtrFree( pNtk->vObjs );
    Vec_PtrFree( pNtk->vBoxes );
    ABC_FREE( pNtk->vTravIds.pArray );
    if ( pNtk->vLevelsR ) Vec_IntFree( pNtk->vLevelsR );
    ABC_FREE( pNtk->pModel );
    ABC_FREE( pNtk->pSeqModel );
    if ( pNtk->vSeqModelVec )
        Vec_PtrFreeFree( pNtk->vSeqModelVec );
    TotalMemory  = 0;
    TotalMemory += pNtk->pMmObj? Mem_FixedReadMemUsage(pNtk->pMmObj)  : 0;
    TotalMemory += pNtk->pMmStep? Mem_StepReadMemUsage(pNtk->pMmStep) : 0;
//    fprintf( stdout, "The total memory allocated internally by the network = %0.2f MB.\n", ((double)TotalMemory)/(1<<20) );
    // free the storage 
    if ( pNtk->pMmObj )
        Mem_FixedStop( pNtk->pMmObj, 0 );
    if ( pNtk->pMmStep )
        Mem_StepStop ( pNtk->pMmStep, 0 );
    // name manager
    Nm_ManFree( pNtk->pManName );
    // free the timing manager
    if ( pNtk->pManTime )
        Abc_ManTimeStop( pNtk->pManTime );
    Vec_IntFreeP( &pNtk->vPhases );
    // start the functionality manager
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_AigFree( (Abc_Aig_t *)pNtk->pManFunc );
    else if ( Abc_NtkHasSop(pNtk) || Abc_NtkHasBlifMv(pNtk) )
        Mem_FlexStop( (Mem_Flex_t *)pNtk->pManFunc, 0 );
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        Extra_StopManager( (DdManager *)pNtk->pManFunc );
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        { if ( pNtk->pManFunc ) Hop_ManStop( (Hop_Man_t *)pNtk->pManFunc ); }
    else if ( Abc_NtkHasMapping(pNtk) )
        pNtk->pManFunc = NULL;
    else if ( !Abc_NtkHasBlackbox(pNtk) )
        assert( 0 );
    // free the hierarchy
    if ( pNtk->pDesign )
    {
        Abc_DesFree( pNtk->pDesign, pNtk );
        pNtk->pDesign = NULL;
    }
//    if ( pNtk->pBlackBoxes ) 
//        Vec_IntFree( pNtk->pBlackBoxes );
    // free node attributes
    Vec_PtrForEachEntry( Abc_Obj_t *, pNtk->vAttrs, pAttrMan, i )
        if ( pAttrMan )
            Vec_AttFree( (Vec_Att_t *)pAttrMan, 1 );
    assert( pNtk->pSCLib == NULL );
    Vec_IntFreeP( &pNtk->vGates );
    Vec_PtrFree( pNtk->vAttrs );
    Vec_IntFreeP( &pNtk->vNameIds );
    ABC_FREE( pNtk->pWLoadUsed );
    ABC_FREE( pNtk->pName );
    ABC_FREE( pNtk->pSpec );
    ABC_FREE( pNtk->pLutTimes );
    if ( pNtk->vOnehots )
        Vec_VecFree( (Vec_Vec_t *)pNtk->vOnehots );
    Vec_PtrFreeP( &pNtk->vLtlProperties );
    Vec_IntFreeP( &pNtk->vObjPerm );
    Vec_IntFreeP( &pNtk->vTopo );
    ABC_FREE( pNtk );
}